

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O3

void __thiscall
Assimp::FBX::Node::EndPropertiesBinary(Node *this,StreamWriterLE *s,size_t num_properties)

{
  ulong uVar1;
  size_t sVar2;
  element_type *peVar3;
  int iVar4;
  undefined4 extraout_var;
  
  if (num_properties == 0) {
    return;
  }
  StreamWriter<false,_false>::Flush(s);
  iVar4 = (*((s->stream).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_IOStream[5])();
  uVar1 = this->property_start;
  if (uVar1 < CONCAT44(extraout_var,iVar4)) {
    sVar2 = this->start_pos;
    StreamWriter<false,_false>::Flush(s);
    peVar3 = (s->stream).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar3->_vptr_IOStream[4])(peVar3,sVar2 + 4,0);
    StreamWriter<false,_false>::Put<unsigned_int>(s,(uint)num_properties);
    StreamWriter<false,_false>::Put<unsigned_int>(s,iVar4 - (int)uVar1);
    StreamWriter<false,_false>::Flush(s);
    peVar3 = (s->stream).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar3->_vptr_IOStream[4])(peVar3,CONCAT44(extraout_var,iVar4),0);
    return;
  }
  __assert_fail("pos > property_start",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/FBX/FBXExportNode.cpp"
                ,0x161,
                "void Assimp::FBX::Node::EndPropertiesBinary(Assimp::StreamWriterLE &, size_t)");
}

Assistant:

void FBX::Node::EndPropertiesBinary(
    Assimp::StreamWriterLE &s,
    size_t num_properties
) {
    if (num_properties == 0) { return; }
    size_t pos = s.Tell();
    ai_assert(pos > property_start);
    size_t property_section_size = pos - property_start;
    s.Seek(start_pos + 4);
    s.PutU4(uint32_t(num_properties));
    s.PutU4(uint32_t(property_section_size));
    s.Seek(pos);
}